

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecurityDirWrapper.cpp
# Opt level: O2

QString * __thiscall
SecurityDirWrapper::translateFieldContent
          (QString *__return_storage_ptr__,SecurityDirWrapper *this,size_t fieldId)

{
  WIN_CERTIFICATE *pWVar1;
  
  if ((fieldId == 2) && (pWVar1 = getCert(this), pWVar1 != (WIN_CERTIFICATE *)0x0)) {
    translateType(__return_storage_ptr__,this,(uint)pWVar1->wCertificateType);
    return __return_storage_ptr__;
  }
  QString::QString(__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

QString SecurityDirWrapper::translateFieldContent(size_t fieldId)
{
    if (fieldId != TYPE) return "";

    pe::WIN_CERTIFICATE* cert = getCert();
    if (cert == NULL) return "";

    return translateType(cert->wCertificateType);
}